

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall VSlider::draw(VSlider *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Theme *pTVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined8 in_XMM1_Qa;
  double dVar11;
  float fVar12;
  double dVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  SaveState state;
  undefined1 local_410 [1024];
  
  pTVar7 = ((this->super_Widget).dialog)->theme;
  uVar14._0_4_ = (pTVar7->fg).r;
  uVar14._4_4_ = (pTVar7->fg).g;
  uVar15._0_4_ = (pTVar7->fg).b;
  uVar15._4_4_ = (pTVar7->fg).a;
  iVar3 = (this->super_Widget).x1;
  iVar4 = (this->super_Widget).y1;
  iVar5 = (this->super_Widget).x2;
  iVar6 = (this->super_Widget).y2;
  al_store_state(local_410,0xffff);
  iVar10 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar10 != '\0') {
    uVar14 = al_map_rgb(0x40,0x40,0x40);
    uVar15 = in_XMM1_Qa;
  }
  fVar9 = (float)iVar3 + 0.5;
  dVar11 = (double)iVar4 + 0.5;
  dVar13 = (double)iVar5 + 0.5;
  fVar12 = (float)dVar13;
  fVar8 = (float)iVar6 + 0.5;
  al_draw_rectangle(fVar9,CONCAT44((int)((ulong)dVar11 >> 0x20),(float)dVar11),
                    CONCAT44((int)((ulong)dVar13 >> 0x20),fVar12),fVar8,uVar14,uVar15,0x3f800000);
  uVar14 = *(undefined8 *)&(this->super_Widget).field_0x34;
  fVar8 = (fVar8 + -0.5) -
          (float)(int)((double)(((this->super_Widget).y2 - (this->super_Widget).y1) - 6) *
                      ((double)(int)uVar14 / (double)(int)((ulong)uVar14 >> 0x20)));
  uVar1._0_4_ = (pTVar7->fg).r;
  uVar1._4_4_ = (pTVar7->fg).g;
  uVar2._0_4_ = (pTVar7->fg).b;
  uVar2._4_4_ = (pTVar7->fg).a;
  al_draw_filled_rectangle
            (fVar9 + 0.5,(float)((int)fVar8 + -5),fVar12 + -0.5,(float)(int)fVar8,uVar1,uVar2);
  al_restore_state(local_410);
  return;
}

Assistant:

void VSlider::draw()
{
   const Theme & theme = dialog->get_theme();
   ALLEGRO_COLOR bg = theme.fg;
   float left = x1 + 0.5, top = y1 + 0.5;
   float right = x2 + 0.5, bottom = y2 + 0.5;
   SaveState state;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_rectangle(left, top, right, bottom, bg, 1);

   double ratio = (double) this->cur_value / (double) this->max_value;
   int ypos = (int) (bottom - 0.5 - (int) (ratio * (height() - 7)));
   al_draw_filled_rectangle(left + 0.5, ypos - 5, right - 0.5, ypos, theme.fg);
}